

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

dropt_char ** dropt_parse(dropt_context *context,int argc,dropt_char **argv)

{
  bool bVar1;
  char_array optionName;
  undefined1 local_48 [8];
  parse_state ps;
  dropt_char *arg;
  dropt_char **argv_local;
  int argc_local;
  dropt_context *context_local;
  
  local_48 = (undefined1  [8])0x0;
  ps.option = (dropt_option *)0x0;
  ps.optionArgument = (dropt_char *)argv;
  if (argv != (dropt_char **)0x0) {
    if (context == (dropt_context *)0x0) {
      dropt_misuse("No dropt context specified.",
                   "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                   ,0x530);
      optionName = make_char_array("",0);
      set_error_details((dropt_context *)0x0,2,optionName,(dropt_char *)0x0);
    }
    else {
      argv_local._4_4_ = argc;
      if (argc == -1) {
        for (argv_local._4_4_ = 0; argv[argv_local._4_4_] != (dropt_char *)0x0;
            argv_local._4_4_ = argv_local._4_4_ + 1) {
        }
      }
      if (argv_local._4_4_ != 0) {
        init_lookup_tables(context);
        ps.argNext._0_4_ = argv_local._4_4_;
        while( true ) {
          bVar1 = false;
          if (0 < (int)ps.argNext) {
            ps._24_8_ = *(undefined8 *)ps.optionArgument;
            bVar1 = false;
            if ((char *)ps._24_8_ != (char *)0x0) {
              bVar1 = *(char *)ps._24_8_ == '-';
            }
          }
          if ((!bVar1) || (*(char *)(ps._24_8_ + 1) == '\0')) break;
          ps.optionArgument = ps.optionArgument + 8;
          if (*(char *)(ps._24_8_ + 1) == '-') {
            ps.argNext._0_4_ = (int)ps.argNext + -1;
            bVar1 = parse_long_option(context,(parse_state *)local_48,(dropt_char *)ps._24_8_);
          }
          else {
            ps.argNext._0_4_ = (int)ps.argNext + -1;
            bVar1 = parse_short_option(context,(parse_state *)local_48,(dropt_char *)ps._24_8_);
          }
          if (!bVar1) {
            return (dropt_char **)ps.optionArgument;
          }
          local_48 = (undefined1  [8])0x0;
          ps.option = (dropt_option *)0x0;
        }
      }
    }
  }
  return (dropt_char **)ps.optionArgument;
}

Assistant:

dropt_char**
dropt_parse(dropt_context* context,
            int argc, dropt_char** argv)
{
    dropt_char* arg;
    parse_state ps;

    ps.option = NULL;
    ps.optionArgument = NULL;
    ps.argNext = argv;

    if (argv == NULL)
    {
        /* Nothing to do. */
        goto exit;
    }

    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        set_error_details(context, dropt_error_bad_configuration,
                          make_char_array(DROPT_TEXT_LITERAL(""), 0),
                          NULL);
        goto exit;
    }

#ifdef DROPT_NO_STRING_BUFFERS
    if (context->errorHandler == NULL)
    {
        DROPT_MISUSE("No error handler specified.");
        set_error_details(context, dropt_error_bad_configuration,
                          make_char_array(DROPT_TEXT_LITERAL(""), 0),
                          NULL);
        goto exit;
    }
#endif

    if (argc == -1)
    {
        argc = 0;
        while (argv[argc] != NULL) { argc++; }
    }

    if (argc == 0)
    {
        /* Nothing to do. */
        goto exit;
    }

    init_lookup_tables(context);

    ps.argsLeft = argc;

    while (   ps.argsLeft-- > 0
           && (arg = *ps.argNext) != NULL
           && arg[0] == DROPT_TEXT_LITERAL('-'))
    {
        if (arg[1] == DROPT_TEXT_LITERAL('\0'))
        {
            /* - */

            /* This intentionally leaves "-" unprocessed for the caller to
             * deal with.  This allows construction of programs that treat
             * "-" to mean `stdin`.
             */
            goto exit;
        }

        ps.argNext++;

        if (arg[1] == DROPT_TEXT_LITERAL('-'))
        {
            if (!parse_long_option(context, &ps, arg)) { goto exit; }
        }
        else
        {
            /* Short name. (-x) */
            if (!parse_short_option(context, &ps, arg)) { goto exit; }
        }

        ps.option = NULL;
        ps.optionArgument = NULL;
    }

exit:
    return ps.argNext;
}